

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void SetPreviousTracker(Lexer *lexer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (lexer->tracker).col;
  iVar2 = lexer->previousTrackerSpot + 1;
  iVar3 = 0;
  if (iVar2 < lexer->totalTrackers) {
    iVar3 = iVar2;
  }
  lexer->previousTrackerSpot = iVar3;
  lexer->previousTrackers[iVar3].col = iVar1;
  lexer->previousTrackers[iVar3].currentTokenPosition = (lexer->tracker).currentTokenPosition;
  lexer->previousTrackers[iVar3].row = (lexer->tracker).row;
  lexer->previousTrackers[iVar3].tokenEnd = (lexer->tracker).tokenEnd;
  lexer->previousTrackers[iVar3].tokenStart = (lexer->tracker).tokenStart;
  return;
}

Assistant:

void SetPreviousTracker(Lexer* lexer){

	lexer->previousTrackerSpot++;
	if (lexer->previousTrackerSpot >= lexer->totalTrackers){
		lexer->previousTrackerSpot = 0;
	}

	LexerTracker* previous = &lexer->previousTrackers[lexer->previousTrackerSpot];

	previous->col = lexer->tracker.col;
	previous->currentTokenPosition = lexer->tracker.currentTokenPosition;
	previous->row = lexer->tracker.row;
	previous->tokenEnd = lexer->tracker.tokenEnd;
	previous->tokenStart = lexer->tracker.tokenStart;
}